

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

Transform * __thiscall
pbrt::Transform::operator*(Transform *__return_storage_ptr__,Transform *this,Transform *t2)

{
  SquareMatrix<4> local_60;
  
  pbrt::operator*(&local_60,&this->m,&t2->m);
  pbrt::operator*(&__return_storage_ptr__->mInv,&t2->mInv,&this->mInv);
  *(undefined8 *)(__return_storage_ptr__->m).m[0] = local_60.m[0]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[0] + 2) = local_60.m[0]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[1] = local_60.m[1]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[1] + 2) = local_60.m[1]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[2] = local_60.m[2]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[2] + 2) = local_60.m[2]._8_8_;
  *(undefined8 *)(__return_storage_ptr__->m).m[3] = local_60.m[3]._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m).m[3] + 2) = local_60.m[3]._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::operator*(const Transform &t2) const {
    return Transform(m * t2.m, t2.mInv * mInv);
}